

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O2

void __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
checkCharacterImmediatelyAfterLiteral
          (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           *this)

{
  bool bVar1;
  UnicodeChar c;
  char *pcVar2;
  CompileMessage CStack_48;
  
  pcVar2 = (this->input).data;
  if (9 < (byte)(*pcVar2 - 0x30U)) {
    c = UTF8Reader::operator*(&this->input);
    bVar1 = IdentifierMatcher::isIdentifierBody(c);
    if (!bVar1) {
      return;
    }
    pcVar2 = (this->input).data;
  }
  (this->location).location.data = pcVar2;
  Errors::unrecognisedLiteralSuffix<>();
  (*this->_vptr_Tokeniser[2])(this,&CStack_48);
  CompileMessage::~CompileMessage(&CStack_48);
  return;
}

Assistant:

void checkCharacterImmediatelyAfterLiteral()
    {
        if (input.isDigit() || IdentifierMatcher::isIdentifierBody (*input))
        {
            location.location = input;
            throwError (Errors::unrecognisedLiteralSuffix());
        }
    }